

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O1

void google::TruncateLogFile(char *path,int64 limit,int64 keep)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  int *piVar5;
  ostream *poVar6;
  ssize_t sVar7;
  uint uVar8;
  LogStream *pLVar9;
  SendMethod in_R9;
  uint uVar10;
  __off_t _Var11;
  stat statbuf;
  char copybuf [8192];
  LogMessage local_2100;
  code *local_20f0;
  undefined8 uStack_20e8;
  __off_t local_20e0;
  char *local_20d8;
  __off_t local_20d0;
  stat local_20c8;
  undefined1 local_2038 [8200];
  
  iVar2 = strncmp("/proc/self/fd/",path,0xe);
  iVar2 = open(path,(uint)(iVar2 != 0) << 0x11 | 2);
  if (iVar2 == -1) {
    piVar5 = __errno_location();
    if (*piVar5 == 0x1b) {
      iVar2 = truncate(path,0);
      if (iVar2 != -1) {
        LogMessage::LogMessage
                  (&local_2100,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                   ,0x7c5,2);
        pLVar9 = &(local_2100.data_)->stream_;
        std::__ostream_insert<char,std::char_traits<char>>(&pLVar9->super_ostream,"Truncated ",10);
        if (path == (char *)0x0) {
          std::ios::clear((int)pLVar9 + (int)(pLVar9->super_ostream)._vptr_basic_ostream[-3]);
        }
        else {
          sVar4 = strlen(path);
          std::__ostream_insert<char,std::char_traits<char>>(&pLVar9->super_ostream,path,sVar4);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (&pLVar9->super_ostream," due to EFBIG error",0x13);
        LogMessage::~LogMessage(&local_2100);
        return;
      }
      local_20f0 = LogMessage::SendToLog;
      uStack_20e8 = 0;
      ErrnoLogMessage::ErrnoLogMessage
                ((ErrnoLogMessage *)&local_2100,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                 ,0x7c3,2,0,in_R9);
      pLVar9 = &(local_2100.data_)->stream_;
      std::__ostream_insert<char,std::char_traits<char>>
                (&pLVar9->super_ostream,"Unable to truncate ",0x13);
      if (path == (char *)0x0) {
        std::ios::clear((int)pLVar9 + (int)(pLVar9->super_ostream)._vptr_basic_ostream[-3]);
      }
      else {
        sVar4 = strlen(path);
        std::__ostream_insert<char,std::char_traits<char>>(&pLVar9->super_ostream,path,sVar4);
      }
    }
    else {
      local_20f0 = LogMessage::SendToLog;
      uStack_20e8 = 0;
      ErrnoLogMessage::ErrnoLogMessage
                ((ErrnoLogMessage *)&local_2100,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                 ,0x7c8,2,0,in_R9);
      pLVar9 = &(local_2100.data_)->stream_;
      std::__ostream_insert<char,std::char_traits<char>>
                (&pLVar9->super_ostream,"Unable to open ",0xf);
      if (path == (char *)0x0) {
        std::ios::clear((int)pLVar9 + (int)(pLVar9->super_ostream)._vptr_basic_ostream[-3]);
      }
      else {
        sVar4 = strlen(path);
        std::__ostream_insert<char,std::char_traits<char>>(&pLVar9->super_ostream,path,sVar4);
      }
    }
    ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_2100);
    return;
  }
  iVar3 = fstat(iVar2,&local_20c8);
  if (iVar3 == -1) {
    local_20f0 = LogMessage::SendToLog;
    uStack_20e8 = 0;
    ErrnoLogMessage::ErrnoLogMessage
              ((ErrnoLogMessage *)&local_2100,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
               ,0x7ce,2,0,in_R9);
    std::__ostream_insert<char,std::char_traits<char>>
              (&((local_2100.data_)->stream_).super_ostream,"Unable to fstat()",0x11);
  }
  else {
    if (((local_20c8.st_mode & 0xf000) != 0x8000) ||
       ((local_20c8.st_size - keep == 0 || local_20c8.st_size < keep) || local_20c8.st_size <= limit
       )) goto LAB_001203cf;
    local_20e0 = local_20c8.st_size - keep;
    LogMessage::LogMessage
              (&local_2100,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
               ,0x7d9);
    _Var11 = local_20e0;
    pLVar9 = &(local_2100.data_)->stream_;
    std::__ostream_insert<char,std::char_traits<char>>(&pLVar9->super_ostream,"Truncating ",0xb);
    if (path == (char *)0x0) {
      std::ios::clear((int)pLVar9 + (int)(pLVar9->super_ostream)._vptr_basic_ostream[-3]);
    }
    else {
      sVar4 = strlen(path);
      std::__ostream_insert<char,std::char_traits<char>>(&pLVar9->super_ostream,path,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>(&pLVar9->super_ostream," to ",4);
    poVar6 = std::ostream::_M_insert<long>((long)pLVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," bytes",6);
    local_20d8 = path;
    LogMessage::~LogMessage(&local_2100);
    sVar7 = pread(iVar2,local_2038,0x2000,_Var11);
    uVar8 = (uint)sVar7;
    _Var11 = 0;
    if (0 < (int)uVar8) {
      do {
        uVar8 = (uint)sVar7;
        sVar7 = pwrite(iVar2,local_2038,(ulong)(uVar8 & 0x7fffffff),_Var11);
        uVar10 = (uint)sVar7;
        if (uVar10 == 0xffffffff) {
          local_20f0 = LogMessage::SendToLog;
          uStack_20e8 = 0;
          ErrnoLogMessage::ErrnoLogMessage
                    ((ErrnoLogMessage *)&local_2100,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                     ,0x7e2,2,0,in_R9);
          pLVar9 = &(local_2100.data_)->stream_;
          std::__ostream_insert<char,std::char_traits<char>>
                    (&pLVar9->super_ostream,"Unable to write to ",0x13);
          pcVar1 = local_20d8;
          if (local_20d8 == (char *)0x0) {
            std::ios::clear((int)pLVar9 + (int)(pLVar9->super_ostream)._vptr_basic_ostream[-3]);
          }
          else {
            sVar4 = strlen(local_20d8);
            std::__ostream_insert<char,std::char_traits<char>>(&pLVar9->super_ostream,pcVar1,sVar4);
          }
          ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_2100);
          break;
        }
        if (uVar8 != uVar10) {
          local_20d0 = _Var11;
          LogMessage::LogMessage
                    (&local_2100,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                     ,0x7e5,2);
          pLVar9 = &(local_2100.data_)->stream_;
          std::__ostream_insert<char,std::char_traits<char>>
                    (&pLVar9->super_ostream,"Expected to write ",0x12);
          poVar6 = (ostream *)std::ostream::operator<<(pLVar9,uVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,", wrote ",8);
          std::ostream::operator<<(poVar6,uVar10);
          LogMessage::~LogMessage(&local_2100);
          _Var11 = local_20d0;
        }
        local_20e0 = local_20e0 + (ulong)(uVar8 & 0x7fffffff);
        _Var11 = _Var11 + (int)uVar10;
        sVar7 = pread(iVar2,local_2038,0x2000,local_20e0);
        uVar8 = (uint)sVar7;
      } while (0 < (int)uVar8);
    }
    pcVar1 = local_20d8;
    if (uVar8 == 0xffffffff) {
      local_20f0 = LogMessage::SendToLog;
      uStack_20e8 = 0;
      ErrnoLogMessage::ErrnoLogMessage
                ((ErrnoLogMessage *)&local_2100,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                 ,0x7ea,2,0,in_R9);
      pLVar9 = &(local_2100.data_)->stream_;
      std::__ostream_insert<char,std::char_traits<char>>
                (&pLVar9->super_ostream,"Unable to read from ",0x14);
      if (pcVar1 == (char *)0x0) {
        std::ios::clear((int)pLVar9 + (int)(pLVar9->super_ostream)._vptr_basic_ostream[-3]);
      }
      else {
        sVar4 = strlen(pcVar1);
        std::__ostream_insert<char,std::char_traits<char>>(&pLVar9->super_ostream,pcVar1,sVar4);
      }
      ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_2100);
    }
    iVar3 = ftruncate(iVar2,_Var11);
    if (iVar3 != -1) goto LAB_001203cf;
    local_20f0 = LogMessage::SendToLog;
    uStack_20e8 = 0;
    ErrnoLogMessage::ErrnoLogMessage
              ((ErrnoLogMessage *)&local_2100,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
               ,0x7f0,2,0,in_R9);
    pLVar9 = &(local_2100.data_)->stream_;
    std::__ostream_insert<char,std::char_traits<char>>
              (&pLVar9->super_ostream,"Unable to truncate ",0x13);
    if (pcVar1 == (char *)0x0) {
      std::ios::clear((int)pLVar9 + (int)(pLVar9->super_ostream)._vptr_basic_ostream[-3]);
    }
    else {
      sVar4 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>(&pLVar9->super_ostream,pcVar1,sVar4);
    }
  }
  ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_2100);
LAB_001203cf:
  close(iVar2);
  return;
}

Assistant:

void TruncateLogFile(const char *path, int64 limit, int64 keep) {
#ifdef HAVE_UNISTD_H
  struct stat statbuf;
  const int kCopyBlockSize = 8 << 10;
  char copybuf[kCopyBlockSize];
  int64 read_offset, write_offset;
  // Don't follow symlinks unless they're our own fd symlinks in /proc
  int flags = O_RDWR;
  // TODO(hamaji): Support other environments.
#ifdef OS_LINUX
  const char *procfd_prefix = "/proc/self/fd/";
  if (strncmp(procfd_prefix, path, strlen(procfd_prefix))) flags |= O_NOFOLLOW;
#endif

  int fd = open(path, flags);
  if (fd == -1) {
    if (errno == EFBIG) {
      // The log file in question has got too big for us to open. The
      // real fix for this would be to compile logging.cc (or probably
      // all of base/...) with -D_FILE_OFFSET_BITS=64 but that's
      // rather scary.
      // Instead just truncate the file to something we can manage
      if (truncate(path, 0) == -1) {
        PLOG(ERROR) << "Unable to truncate " << path;
      } else {
        LOG(ERROR) << "Truncated " << path << " due to EFBIG error";
      }
    } else {
      PLOG(ERROR) << "Unable to open " << path;
    }
    return;
  }

  if (fstat(fd, &statbuf) == -1) {
    PLOG(ERROR) << "Unable to fstat()";
    goto out_close_fd;
  }

  // See if the path refers to a regular file bigger than the
  // specified limit
  if (!S_ISREG(statbuf.st_mode)) goto out_close_fd;
  if (statbuf.st_size <= limit)  goto out_close_fd;
  if (statbuf.st_size <= keep) goto out_close_fd;

  // This log file is too large - we need to truncate it
  LOG(INFO) << "Truncating " << path << " to " << keep << " bytes";

  // Copy the last "keep" bytes of the file to the beginning of the file
  read_offset = statbuf.st_size - keep;
  write_offset = 0;
  int bytesin, bytesout;
  while ((bytesin = pread(fd, copybuf, sizeof(copybuf), read_offset)) > 0) {
    bytesout = pwrite(fd, copybuf, bytesin, write_offset);
    if (bytesout == -1) {
      PLOG(ERROR) << "Unable to write to " << path;
      break;
    } else if (bytesout != bytesin) {
      LOG(ERROR) << "Expected to write " << bytesin << ", wrote " << bytesout;
    }
    read_offset += bytesin;
    write_offset += bytesout;
  }
  if (bytesin == -1) PLOG(ERROR) << "Unable to read from " << path;

  // Truncate the remainder of the file. If someone else writes to the
  // end of the file after our last read() above, we lose their latest
  // data. Too bad ...
  if (ftruncate(fd, write_offset) == -1) {
    PLOG(ERROR) << "Unable to truncate " << path;
  }

 out_close_fd:
  close(fd);
#else
  LOG(ERROR) << "No log truncation support.";
#endif
}